

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Var * __thiscall kratos::Generator::var(Generator *this,string *var_name,uint32_t width)

{
  initializer_list<unsigned_int> __l;
  Var *pVVar1;
  allocator<unsigned_int> local_4d;
  uint local_4c;
  iterator local_48;
  size_type local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  uint32_t local_1c;
  string *psStack_18;
  uint32_t width_local;
  string *var_name_local;
  Generator *this_local;
  
  local_4c = 1;
  local_48 = &local_4c;
  local_40 = 1;
  local_1c = width;
  psStack_18 = var_name;
  var_name_local = (string *)this;
  std::allocator<unsigned_int>::allocator(&local_4d);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,__l,&local_4d);
  pVVar1 = var(this,var_name,width,&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  std::allocator<unsigned_int>::~allocator(&local_4d);
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width) {
    return var(var_name, width, std::vector<uint32_t>{1});
}